

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

EnvNAVXYTHETALATHashEntry_t * __thiscall
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_hash
          (EnvironmentNAVXYTHETALAT *this,int X,int Y,int Theta)

{
  pointer *pppiVar1;
  pointer *pppEVar2;
  vector<EnvNAVXYTHETALATHashEntry_t*,std::allocator<EnvNAVXYTHETALATHashEntry_t*>> *this_00;
  iterator iVar3;
  iterator __position;
  pointer ppiVar4;
  int iVar5;
  SBPL_Exception *this_01;
  char cVar6;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  int *entry;
  EnvNAVXYTHETALATHashEntry_t *local_30;
  int *local_28;
  
  cVar6 = (char)Theta;
  local_30 = (EnvNAVXYTHETALATHashEntry_t *)operator_new(0x14);
  local_30->X = X;
  local_30->Y = Y;
  local_30->Theta = cVar6;
  local_30->iteration = 0;
  iVar3._M_current =
       (this->StateID2CoordTable).
       super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30->stateID =
       (int)((ulong)((long)iVar3._M_current -
                    (long)(this->StateID2CoordTable).
                          super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (iVar3._M_current ==
      (this->StateID2CoordTable).
      super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<EnvNAVXYTHETALATHashEntry_t*,std::allocator<EnvNAVXYTHETALATHashEntry_t*>>::
    _M_realloc_insert<EnvNAVXYTHETALATHashEntry_t*const&>
              ((vector<EnvNAVXYTHETALATHashEntry_t*,std::allocator<EnvNAVXYTHETALATHashEntry_t*>> *)
               &this->StateID2CoordTable,iVar3,&local_30);
    X = local_30->X;
    Y = local_30->Y;
    cVar6 = local_30->Theta;
  }
  else {
    *iVar3._M_current = local_30;
    pppEVar2 = &(this->StateID2CoordTable).
                super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppEVar2 = *pppEVar2 + 1;
  }
  iVar5 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            _vptr_DiscreteSpaceInformation[0x59])
                    (this,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)(int)cVar6);
  this_00 = (vector<EnvNAVXYTHETALATHashEntry_t*,std::allocator<EnvNAVXYTHETALATHashEntry_t*>> *)
            (this->Coord2StateIDHashTable + iVar5);
  iVar3._M_current = *(EnvNAVXYTHETALATHashEntry_t ***)(this_00 + 8);
  if (iVar3._M_current == *(EnvNAVXYTHETALATHashEntry_t ***)(this_00 + 0x10)) {
    std::vector<EnvNAVXYTHETALATHashEntry_t*,std::allocator<EnvNAVXYTHETALATHashEntry_t*>>::
    _M_realloc_insert<EnvNAVXYTHETALATHashEntry_t*const&>(this_00,iVar3,&local_30);
  }
  else {
    *iVar3._M_current = local_30;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  local_28 = (int *)operator_new__(8);
  __position._M_current =
       (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
       StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.StateID2IndexMapping
      .super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
              ((vector<int*,std::allocator<int*>> *)
               &(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                StateID2IndexMapping,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppiVar1 = &(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppiVar1 = *pppiVar1 + 1;
  }
  ppiVar4 = (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  *ppiVar4[local_30->stateID] = -1;
  ppiVar4[local_30->stateID][1] = -1;
  if (local_30->stateID ==
      (int)((ulong)((long)(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                          StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppiVar4) >> 3) + -1) {
    return local_30;
  }
  this_01 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception
            (this_01,"ERROR in Env... function: last state has incorrect stateID");
  __cxa_throw(this_01,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EnvNAVXYTHETALATHashEntry_t*
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_hash(int X, int Y, int Theta)
{
    int i;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    EnvNAVXYTHETALATHashEntry_t* HashEntry = new EnvNAVXYTHETALATHashEntry_t;

    HashEntry->X = X;
    HashEntry->Y = Y;
    HashEntry->Theta = Theta;
    HashEntry->iteration = 0;

    HashEntry->stateID = StateID2CoordTable.size();

    // insert into the tables
    StateID2CoordTable.push_back(HashEntry);

    // get the hash table bin
    i = GETHASHBIN(HashEntry->X, HashEntry->Y, HashEntry->Theta);

    // insert the entry into the bin
    Coord2StateIDHashTable[i].push_back(HashEntry);

    // insert into and initialize the mappings
    int* entry = new int[NUMOFINDICES_STATEID2IND];
    StateID2IndexMapping.push_back(entry);
    for (i = 0; i < NUMOFINDICES_STATEID2IND; i++) {
        StateID2IndexMapping[HashEntry->stateID][i] = -1;
    }

    if (HashEntry->stateID != (int)StateID2IndexMapping.size() - 1) {
        throw SBPL_Exception("ERROR in Env... function: last state has incorrect stateID");
    }

#if TIME_DEBUG
    time_createhash += clock() - currenttime;
#endif

    return HashEntry;
}